

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::optional(optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *v)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  
  bVar3 = v->set;
  this->set = bVar3;
  if (bVar3 == true) {
    puVar1 = (undefined8 *)((long)&this->optionalValue + 0x18);
    *(undefined4 *)&this->optionalValue = *(undefined4 *)&v->optionalValue;
    *(undefined8 **)((long)&this->optionalValue + 8) = puVar1;
    puVar2 = (undefined8 *)((long)&v->optionalValue + 0x18);
    puVar4 = *(undefined8 **)((long)&v->optionalValue + 8);
    if (puVar4 == puVar2) {
      uVar5 = *(undefined8 *)((long)&v->optionalValue + 0x20);
      *puVar1 = *puVar2;
      *(undefined8 *)((long)&this->optionalValue + 0x20) = uVar5;
    }
    else {
      *(undefined8 **)((long)&this->optionalValue + 8) = puVar4;
      *(undefined8 *)((long)&this->optionalValue + 0x18) = *puVar2;
    }
    *(undefined8 *)((long)&this->optionalValue + 0x10) =
         *(undefined8 *)((long)&v->optionalValue + 0x10);
    *(undefined8 **)((long)&v->optionalValue + 8) = puVar2;
    *(undefined8 *)((long)&v->optionalValue + 0x10) = 0;
    (v->optionalValue).__data[0x18] = '\0';
    if (v->set == true) {
      v->set = false;
    }
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    bool has_value() const { return set; }